

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,ExtPubkey *ext_pubkey,string *arg)

{
  string *this_00;
  ExtPubkey *this_01;
  SchnorrPubkey local_48;
  byte local_2e;
  allocator local_2d [13];
  string *local_20;
  string *arg_local;
  ExtPubkey *ext_pubkey_local;
  DescriptorKeyReference *this_local;
  
  this->key_type_ = kDescriptorKeyBip32;
  local_20 = arg;
  arg_local = (string *)ext_pubkey;
  ext_pubkey_local = (ExtPubkey *)this;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  this_01 = (ExtPubkey *)&this->pubkey_;
  ExtPubkey::GetPubkey((Pubkey *)this_01,(ExtPubkey *)arg_local);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(this_01,(ExtPubkey *)this);
  KeyData::KeyData(&this->key_data_);
  this_00 = &this->argument_;
  local_2e = 0;
  if (local_20 == (string *)0x0) {
    ::std::allocator<char>::allocator();
    local_2e = 1;
    ::std::__cxx11::string::string((string *)this_00,"",local_2d);
  }
  else {
    ::std::__cxx11::string::string((string *)this_00,(string *)local_20);
  }
  if ((local_2e & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  SchnorrPubkey::FromPubkey(&local_48,&this->pubkey_,(bool *)0x0);
  SchnorrPubkey::operator=(&this->schnorr_pubkey_,&local_48);
  SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x40cb94);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const ExtPubkey& ext_pubkey, const std::string* arg)
    : key_type_(DescriptorKeyType::kDescriptorKeyBip32),
      pubkey_(ext_pubkey.GetPubkey()),
      extpubkey_(ext_pubkey),
      argument_((arg) ? *arg : "") {
  schnorr_pubkey_ = SchnorrPubkey::FromPubkey(pubkey_);
}